

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSymmetry.c
# Opt level: O0

int cuddSymmCheck(DdManager *table,int x,int y)

{
  DdHalfWord DVar1;
  DdNode *pDVar2;
  bool bVar3;
  bool bVar4;
  DdNode *pDVar5;
  DdNode *sentinel;
  int slots;
  DdNodePtr *list;
  int i;
  int yindex;
  int TotalRefCount;
  int arccount;
  int xsymmyp;
  int xsymmy;
  int comple;
  DdNode *f10;
  DdNode *f11;
  DdNode *f00;
  DdNode *f01;
  DdNode *f1;
  DdNode *f0;
  DdNode *f;
  int y_local;
  int x_local;
  DdManager *table_local;
  
  if (table->subtables[x].keys == 1) {
    table_local._4_4_ = 0;
  }
  else {
    DVar1 = table->invperm[y];
    if ((table->subtables[y].keys == 1) && (table->vars[(int)DVar1]->ref == 1)) {
      table_local._4_4_ = 0;
    }
    else {
      bVar4 = true;
      bVar3 = true;
      yindex = 0;
      for (list._4_4_ = 0; list._4_4_ < (int)table->subtables[x].slots; list._4_4_ = list._4_4_ + 1)
      {
        for (f0 = table->subtables[x].nodelist[list._4_4_]; (DdManager *)f0 != table; f0 = f0->next)
        {
          pDVar2 = (f0->type).kids.T;
          pDVar5 = (DdNode *)((ulong)(f0->type).kids.E & 0xfffffffffffffffe);
          if (pDVar2->index == DVar1) {
            yindex = yindex + 1;
            _xsymmy = (pDVar2->type).kids.E;
            f10 = (pDVar2->type).kids.T;
          }
          else {
            _xsymmy = pDVar2;
            f10 = pDVar2;
            if ((pDVar5->index != DVar1) &&
               (((pDVar2 != table->one || (pDVar5 != table->one)) || (f0->ref != 1)))) {
              return 0;
            }
          }
          f11 = pDVar5;
          f00 = pDVar5;
          if (pDVar5->index == DVar1) {
            yindex = yindex + 1;
            f11 = (pDVar5->type).kids.E;
            f00 = (pDVar5->type).kids.T;
          }
          if (((ulong)(f0->type).kids.E & 1) != 0) {
            f00 = (DdNode *)((ulong)f00 ^ 1);
            f11 = (DdNode *)((ulong)f11 ^ 1);
          }
          if (((pDVar2 != table->one) || (pDVar5 != table->one)) || (f0->ref != 1)) {
            bVar3 = (bool)(f00 == _xsymmy & bVar3);
            bVar4 = (bool)(f10 == f11 & bVar4);
            if ((!bVar3) && (!bVar4)) {
              return 0;
            }
          }
        }
      }
      i = -1;
      for (list._4_4_ = 0; list._4_4_ < (int)table->subtables[y].slots; list._4_4_ = list._4_4_ + 1)
      {
        for (f0 = table->subtables[y].nodelist[list._4_4_]; (DdManager *)f0 != table; f0 = f0->next)
        {
          i = f0->ref + i;
        }
      }
      table_local._4_4_ = (uint)(yindex == i);
    }
  }
  return table_local._4_4_;
}

Assistant:

int
cuddSymmCheck(
  DdManager * table,
  int  x,
  int  y)
{
    DdNode *f,*f0,*f1,*f01,*f00,*f11,*f10;
    int comple;         /* f0 is complemented */
    int xsymmy;         /* x and y may be positively symmetric */
    int xsymmyp;        /* x and y may be negatively symmetric */
    int arccount;       /* number of arcs from layer x to layer y */
    int TotalRefCount;  /* total reference count of layer y minus 1 */
    int yindex;
    int i;
    DdNodePtr *list;
    int slots;
    DdNode *sentinel = &(table->sentinel);
#ifdef DD_DEBUG
    int xindex;
#endif

    /* Checks that x and y are not the projection functions.
    ** For x it is sufficient to check whether there is only one
    ** node; indeed, if there is one node, it is the projection function
    ** and it cannot point to y. Hence, if y isn't just the projection
    ** function, it has one arc coming from a layer different from x.
    */
    if (table->subtables[x].keys == 1) {
        return(0);
    }
    yindex = table->invperm[y];
    if (table->subtables[y].keys == 1) {
        if (table->vars[yindex]->ref == 1)
            return(0);
    }

    xsymmy = xsymmyp = 1;
    arccount = 0;
    slots = table->subtables[x].slots;
    list = table->subtables[x].nodelist;
    for (i = 0; i < slots; i++) {
        f = list[i];
        while (f != sentinel) {
            /* Find f1, f0, f11, f10, f01, f00. */
            f1 = cuddT(f);
            f0 = Cudd_Regular(cuddE(f));
            comple = Cudd_IsComplement(cuddE(f));
            if ((int) f1->index == yindex) {
                arccount++;
                f11 = cuddT(f1); f10 = cuddE(f1);
            } else {
                if ((int) f0->index != yindex) {
                    /* If f is an isolated projection function it is
                    ** allowed to bypass layer y.
                    */
                    if (f1 != DD_ONE(table) || f0 != DD_ONE(table) || f->ref != 1)
                        return(0); /* f bypasses layer y */
                }
                f11 = f10 = f1;
            }
            if ((int) f0->index == yindex) {
                arccount++;
                f01 = cuddT(f0); f00 = cuddE(f0);
            } else {
                f01 = f00 = f0;
            }
            if (comple) {
                f01 = Cudd_Not(f01);
                f00 = Cudd_Not(f00);
            }

            if (f1 != DD_ONE(table) || f0 != DD_ONE(table) || f->ref != 1) {
                xsymmy &= f01 == f10;
                xsymmyp &= f11 == f00;
                if ((xsymmy == 0) && (xsymmyp == 0))
                    return(0);
            }

            f = f->next;
        } /* while */
    } /* for */

    /* Calculate the total reference counts of y */
    TotalRefCount = -1; /* -1 for projection function */
    slots = table->subtables[y].slots;
    list = table->subtables[y].nodelist;
    for (i = 0; i < slots; i++) {
        f = list[i];
        while (f != sentinel) {
            TotalRefCount += f->ref;
            f = f->next;
        }
    }

#if defined(DD_DEBUG) && defined(DD_VERBOSE)
    if (arccount == TotalRefCount) {
        xindex = table->invperm[x];
        (void) fprintf(table->out,
                       "Found symmetry! x =%d\ty = %d\tPos(%d,%d)\n",
                       xindex,yindex,x,y);
    }
#endif

    return(arccount == TotalRefCount);

}